

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

String * kj::Path::stripNul(String *__return_storage_ptr__,String *input)

{
  size_t capacity;
  Array<char> local_80;
  char local_62;
  char local_61;
  char *pcStack_60;
  char c;
  char *__end1;
  char *local_48;
  char *__begin1;
  String *__range1;
  Vector<char> output;
  String *input_local;
  
  output.builder.disposer = (ArrayDisposer *)input;
  capacity = String::size(input);
  Vector<char>::Vector((Vector<char> *)&__range1,capacity);
  __begin1 = (char *)input;
  local_48 = String::begin(input);
  pcStack_60 = String::end((String *)__begin1);
  for (; local_48 != pcStack_60; local_48 = local_48 + 1) {
    local_61 = *local_48;
    if (local_61 != '\0') {
      Vector<char>::add<char&>((Vector<char> *)&__range1,&local_61);
    }
  }
  local_62 = '\0';
  Vector<char>::add<char>((Vector<char> *)&__range1,&local_62);
  Vector<char>::releaseAsArray(&local_80,(Vector<char> *)&__range1);
  String::String(__return_storage_ptr__,&local_80);
  Array<char>::~Array(&local_80);
  Vector<char>::~Vector((Vector<char> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

String Path::stripNul(String input) {
  kj::Vector<char> output(input.size());
  for (char c: input) {
    if (c != '\0') output.add(c);
  }
  output.add('\0');
  return String(output.releaseAsArray());
}